

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  pointer ppTVar1;
  ostream *poVar2;
  pointer ppTVar3;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  string kTestsuites;
  allocator local_8e;
  allocator local_8d;
  int local_8c;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_68,"testsuites",(allocator *)&local_88);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar2 = std::operator<<(stream,"<");
  std::operator<<(poVar2,(string *)&local_68);
  local_8c = 0;
  for (ppTVar3 = (test_suites->
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 !=
      (test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish; ppTVar3 = ppTVar3 + 1) {
    local_8c = local_8c +
               (int)((ulong)((long)((*ppTVar3)->test_info_list_).
                                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)((*ppTVar3)->test_info_list_).
                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  std::__cxx11::string::string((string *)&local_88,"tests",&local_8e);
  StreamableToString<int>(&local_48,&local_8c);
  OutputXmlAttribute(stream,&local_68,&local_88,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_88,"name",&local_8e);
  std::__cxx11::string::string((string *)&local_48,"AllTests",&local_8d);
  OutputXmlAttribute(stream,&local_68,&local_88,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::operator<<(stream,">\n");
  ppTVar1 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppTVar3 = (test_suites->
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 1
      ) {
    PrintXmlTestSuite(stream,*ppTVar3);
  }
  poVar2 = std::operator<<(stream,"</");
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (auto test_suite : test_suites) {
    PrintXmlTestSuite(stream, *test_suite);
  }
  *stream << "</" << kTestsuites << ">\n";
}